

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

void __thiscall
OpenMD::Thermo::getInertiaTensor(Thermo *this,Mat3x3d *inertiaTensor,Vector3d *angularMomentum)

{
  Snapshot *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  Molecule *pMVar4;
  pointer ppSVar5;
  StuntDouble *this_01;
  MoleculeIterator i;
  Vector3d r;
  Mat3x3d Itmp;
  RotMat3x3d A;
  Vector3d v;
  Vector3d comVel;
  Vector3d com;
  double local_2e8;
  double dStack_2e0;
  undefined1 local_2d8 [16];
  double local_2c8;
  double dStack_2c0;
  MoleculeIterator local_290;
  Vector<double,_3U> local_288;
  double local_268;
  undefined8 uStack_260;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  double local_248;
  double dStack_240;
  undefined4 local_238;
  undefined4 uStack_234;
  double dStack_230;
  RectMatrix<double,_3U,_3U> local_228;
  RotMat3x3d local_1e0;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  SquareMatrix3<double> local_150;
  SquareMatrix3<double> local_108;
  SquareMatrix3<double> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if ((this_00->hasInertiaTensor != true) || (this_00->hasCOMw == false)) {
    local_1e0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_228,(double *)&local_1e0);
    Vector<double,_3U>::Vector(&local_168,(Vector<double,_3U> *)&local_228);
    local_1e0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_228,(double *)&local_1e0);
    Vector<double,_3U>::Vector(&local_180,(Vector<double,_3U> *)&local_228);
    getComAll(this,(Vector3d *)&local_168,(Vector3d *)&local_180);
    local_290._M_node = (_Base_ptr)0x0;
    local_1e0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_228,(double *)&local_1e0);
    Vector<double,_3U>::Vector(&local_288,(Vector<double,_3U> *)&local_228);
    local_1e0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_228,(double *)&local_1e0);
    Vector<double,_3U>::Vector(&local_198,(Vector<double,_3U> *)&local_228);
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_228);
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_290);
    local_2d8 = ZEXT816(0);
    local_2c8 = 0.0;
    dStack_2c0 = 0.0;
    local_2e8 = 0.0;
    dStack_2e0 = 0.0;
LAB_001343d2:
    if (pMVar4 != (Molecule *)0x0) {
      ppSVar5 = (pMVar4->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar5 ==
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = (StuntDouble *)0x0;
        auVar1 = local_2d8;
        goto LAB_0013440a;
      }
      do {
        this_01 = *ppSVar5;
        auVar1._8_4_ = (int)local_2d8._8_8_;
        auVar1._0_8_ = local_2d8._0_8_;
        auVar1._12_4_ = (int)((ulong)local_2d8._8_8_ >> 0x20);
LAB_0013440a:
        do {
          local_2d8 = auVar1;
          if (this_01 == (StuntDouble *)0x0) {
            pMVar4 = SimInfo::nextMolecule(this->info_,&local_290);
            goto LAB_001343d2;
          }
          StuntDouble::getPos((Vector3d *)&local_78,this_01);
          operator-((Vector<double,_3U> *)&local_1e0,(Vector<double,_3U> *)&local_78,&local_168);
          Vector3<double>::operator=((Vector3<double> *)&local_288,(Vector<double,_3U> *)&local_1e0)
          ;
          StuntDouble::getVel((Vector3d *)&local_78,this_01);
          operator-((Vector<double,_3U> *)&local_1e0,(Vector<double,_3U> *)&local_78,&local_180);
          Vector3<double>::operator=((Vector3<double> *)&local_198,(Vector<double,_3U> *)&local_1e0)
          ;
          local_268 = this_01->mass_;
          uStack_260 = 0;
          local_238 = local_288.data_[0]._0_4_;
          uStack_234 = local_288.data_[0]._4_4_;
          dStack_230 = local_288.data_[1];
          uStack_250 = SUB84(local_288.data_[2],0);
          uStack_24c = (undefined4)((ulong)local_288.data_[2] >> 0x20);
          local_258 = local_288.data_[0]._0_4_;
          uStack_254 = local_288.data_[0]._4_4_;
          local_248 = local_288.data_[1];
          dStack_240 = local_288.data_[2];
          cross<double>((Vector3<double> *)&local_78,(Vector3<double> *)&local_288,
                        (Vector3<double> *)&local_198);
          operator*((Vector<double,_3U> *)&local_1e0,(Vector<double,_3U> *)&local_78,local_268);
          Vector<double,_3U>::add
                    (&angularMomentum->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1e0);
          if (this_01->objType_ - otDAtom < 2) {
            StuntDouble::getA(&local_1e0,this_01);
            SquareMatrix3<double>::transpose(&local_150,&local_1e0);
            (*this_01->_vptr_StuntDouble[5])(&local_108,this_01);
            operator*(&local_c0,&local_150,&local_108);
            operator*((SquareMatrix3<double> *)&local_78,&local_c0,&local_1e0);
            RectMatrix<double,_3U,_3U>::add(&local_228,&local_78);
            StuntDouble::getJ((Vector3d *)&local_78,this_01);
            Vector<double,_3U>::add
                      (&angularMomentum->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_78);
          }
          dVar3 = (double)CONCAT44(uStack_234,local_238);
          dVar2 = dStack_230 * (double)CONCAT44(uStack_254,local_258) * local_268 +
                  (double)local_2d8._0_8_;
          local_2d8._8_8_ =
               dVar3 * (double)CONCAT44(uStack_24c,uStack_250) * local_268 + (double)local_2d8._8_8_
          ;
          local_2e8 = dStack_240 * local_248 * local_268 + local_2e8;
          dStack_2e0 = dStack_240 * dStack_240 * local_268 + dStack_2e0;
          local_2c8 = dStack_230 * dStack_230 * local_268 + local_2c8;
          dStack_2c0 = dVar3 * dVar3 * local_268 + dStack_2c0;
          ppSVar5 = ppSVar5 + 1;
          this_01 = (StuntDouble *)0x0;
          auVar1._8_4_ = (int)local_2d8._8_8_;
          auVar1._0_8_ = dVar2;
          auVar1._12_4_ = (int)((ulong)local_2d8._8_8_ >> 0x20);
          local_2d8._0_8_ = dVar2;
        } while (ppSVar5 ==
                 (pMVar4->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      } while( true );
    }
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         local_2c8 + dStack_2e0;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] =
         -(double)local_2d8._0_8_;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] =
         -(double)local_2d8._8_8_;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         -(double)local_2d8._0_8_;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] =
         dStack_2e0 + dStack_2c0;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] =
         -local_2e8;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] =
         -(double)local_2d8._8_8_;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] =
         -local_2e8;
    (inertiaTensor->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         dStack_2c0 + local_2c8;
    RectMatrix<double,_3U,_3U>::add((RectMatrix<double,_3U,_3U> *)inertiaTensor,&local_228);
    Snapshot::setCOMw(this_00,angularMomentum);
    Snapshot::setInertiaTensor(this_00,inertiaTensor);
  }
  Snapshot::getCOMw((Vector3d *)&local_228,this_00);
  Vector<double,_3U>::operator=
            (&angularMomentum->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_228);
  Snapshot::getInertiaTensor((Mat3x3d *)&local_228,this_00);
  RectMatrix<double,_3U,_3U>::operator=((RectMatrix<double,_3U,_3U> *)inertiaTensor,&local_228);
  return;
}

Assistant:

void Thermo::getInertiaTensor(Mat3x3d& inertiaTensor,
                                Vector3d& angularMomentum) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Molecule::IntegrableObjectIterator j;
    StuntDouble* sd;

    if (!(snap->hasInertiaTensor && snap->hasCOMw)) {
      RealType xx = 0.0;
      RealType yy = 0.0;
      RealType zz = 0.0;
      RealType xy = 0.0;
      RealType xz = 0.0;
      RealType yz = 0.0;
      Vector3d com(0.0);
      Vector3d comVel(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d r(0.0);
      Vector3d v(0.0);
      Mat3x3d Itmp {};

      RealType m = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          r = sd->getPos() - com;
          v = sd->getVel() - comVel;

          m = sd->getMass();

          // Compute moment of intertia coefficients.
          xx += r[0] * r[0] * m;
          yy += r[1] * r[1] * m;
          zz += r[2] * r[2] * m;

          // compute products of intertia
          xy += r[0] * r[1] * m;
          xz += r[0] * r[2] * m;
          yz += r[1] * r[2] * m;

          angularMomentum += cross(r, v) * m;

          if (sd->isDirectional()) {
            RotMat3x3d A = sd->getA();
            Itmp += A.transpose() * sd->getI() * A;
            angularMomentum += sd->getJ();
          }
        }
      }

      inertiaTensor(0, 0) = yy + zz;
      inertiaTensor(0, 1) = -xy;
      inertiaTensor(0, 2) = -xz;
      inertiaTensor(1, 0) = -xy;
      inertiaTensor(1, 1) = xx + zz;
      inertiaTensor(1, 2) = -yz;
      inertiaTensor(2, 0) = -xz;
      inertiaTensor(2, 1) = -yz;
      inertiaTensor(2, 2) = xx + yy;

      inertiaTensor += Itmp;

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, inertiaTensor.getArrayPointer(), 9,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
      snap->setInertiaTensor(inertiaTensor);
    }

    angularMomentum = snap->getCOMw();
    inertiaTensor   = snap->getInertiaTensor();

    return;
  }